

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion.cxx
# Opt level: O0

int main(int argc,char **argv)

{
  string *epilog_;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  __l;
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  initializer_list<args::EitherFlag> in_01;
  initializer_list<args::EitherFlag> in_02;
  EitherFlag *local_11d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_11b8;
  EitherFlag *local_1188;
  EitherFlag *local_1158;
  EitherFlag *local_1128;
  Completion *e;
  allocator local_10e1;
  string local_10e0;
  allocator local_10b9;
  string local_10b8;
  undefined1 local_1098 [8];
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  pos;
  int local_fa8 [2];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_fa0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_f98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_f70;
  iterator local_f48;
  size_type local_f40;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_f38;
  EitherFlag *local_f00;
  EitherFlag local_ef8;
  EitherFlag local_ed0;
  iterator local_ea8;
  undefined1 local_ea0 [127];
  allocator local_e21;
  string local_e20;
  allocator local_df9;
  string local_df8;
  undefined1 local_dd8 [8];
  MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_args::ValueReader,_args::detail::unordered_map>
  m;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c78;
  EitherFlag *local_c58;
  EitherFlag local_c50;
  EitherFlag local_c28;
  iterator local_c00;
  undefined1 local_bf8 [127];
  allocator local_b79;
  string local_b78;
  allocator local_b51;
  string local_b50;
  undefined1 local_b30 [8];
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  b;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  EitherFlag *local_9b0;
  EitherFlag local_9a8;
  EitherFlag local_980;
  iterator local_958;
  undefined1 local_950 [127];
  allocator local_8d1;
  string local_8d0;
  allocator local_8a9;
  string local_8a8;
  undefined1 local_888 [8];
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  f;
  EitherFlag local_728;
  iterator local_700;
  undefined1 local_6f8 [120];
  undefined1 local_680 [8];
  CompletionFlag c;
  allocator local_4f9;
  string local_4f8;
  undefined1 local_4d8 [8];
  ArgumentParser p;
  char **argv_local;
  int argc_local;
  
  p.helpParams.defaultString.field_2._8_8_ = argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4f8,"parser",&local_4f9);
  epilog_ = (string *)(c.syntax.field_2._M_local_buf + 8);
  std::__cxx11::string::string((string *)epilog_);
  args::ArgumentParser::ArgumentParser((ArgumentParser *)local_4d8,&local_4f8,epilog_);
  std::__cxx11::string::~string((string *)(c.syntax.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  f._336_8_ = &local_728;
  args::EitherFlag::EitherFlag((EitherFlag *)f._336_8_,"complete");
  local_700 = &local_728;
  local_6f8._0_8_ = 1;
  in_02._M_len = 1;
  in_02._M_array = local_700;
  args::Matcher::Matcher((Matcher *)(local_6f8 + 8),in_02);
  args::CompletionFlag::CompletionFlag<args::ArgumentParser>
            ((CompletionFlag *)local_680,(ArgumentParser *)local_4d8,(Matcher *)(local_6f8 + 8));
  args::Matcher::~Matcher((Matcher *)(local_6f8 + 8));
  local_1128 = (EitherFlag *)&local_700;
  do {
    local_1128 = local_1128 + -1;
    args::EitherFlag::~EitherFlag(local_1128);
  } while (local_1128 != &local_728);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8a8,"name",&local_8a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8d0,"description",&local_8d1);
  local_9b0 = &local_9a8;
  args::EitherFlag::EitherFlag(local_9b0,'f');
  local_9b0 = &local_980;
  args::EitherFlag::EitherFlag(local_9b0,"foo");
  local_958 = &local_9a8;
  local_950._0_8_ = 2;
  in_01._M_len = 2;
  in_01._M_array = local_958;
  args::Matcher::Matcher((Matcher *)(local_950 + 8),in_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9d0,"abc",(allocator *)&b.field_0x157);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
               *)local_888,(Group *)local_4d8,&local_8a8,&local_8d0,(Matcher *)(local_950 + 8),
              &local_9d0,false);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::allocator<char>::~allocator((allocator<char> *)&b.field_0x157);
  args::Matcher::~Matcher((Matcher *)(local_950 + 8));
  local_1158 = (EitherFlag *)&local_958;
  do {
    local_1158 = local_1158 + -1;
    args::EitherFlag::~EitherFlag(local_1158);
  } while (local_1158 != &local_9a8);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b50,"name",&local_b51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b78,"description",&local_b79);
  local_c58 = &local_c50;
  args::EitherFlag::EitherFlag(local_c58,'b');
  local_c58 = &local_c28;
  args::EitherFlag::EitherFlag(local_c58,"bar");
  local_c00 = &local_c50;
  local_bf8._0_8_ = 2;
  in_00._M_len = 2;
  in_00._M_array = local_c00;
  args::Matcher::Matcher((Matcher *)(local_bf8 + 8),in_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c78,"abc",(allocator *)&m.field_0x157);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
               *)local_b30,(Group *)local_4d8,&local_b50,&local_b78,(Matcher *)(local_bf8 + 8),
              &local_c78,false);
  std::__cxx11::string::~string((string *)&local_c78);
  std::allocator<char>::~allocator((allocator<char> *)&m.field_0x157);
  args::Matcher::~Matcher((Matcher *)(local_bf8 + 8));
  local_1188 = (EitherFlag *)&local_c00;
  do {
    local_1188 = local_1188 + -1;
    args::EitherFlag::~EitherFlag(local_1188);
  } while (local_1188 != &local_c50);
  std::__cxx11::string::~string((string *)&local_b78);
  std::allocator<char>::~allocator((allocator<char> *)&local_b79);
  std::__cxx11::string::~string((string *)&local_b50);
  std::allocator<char>::~allocator((allocator<char> *)&local_b51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_df8,"mappos",&local_df9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e20,"mappos",&local_e21);
  local_f00 = &local_ef8;
  args::EitherFlag::EitherFlag(local_f00,'m');
  local_f00 = &local_ed0;
  args::EitherFlag::EitherFlag(local_f00,"map");
  local_ea8 = &local_ef8;
  local_ea0._0_8_ = 2;
  in._M_len = 2;
  in._M_array = local_ea8;
  args::Matcher::Matcher((Matcher *)(local_ea0 + 8),in);
  local_fa0 = &local_f98;
  local_fa8[1] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[2],_int,_true>(local_fa0,(char (*) [2])"1",local_fa8 + 1);
  local_fa0 = &local_f70;
  local_fa8[0] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[2],_int,_true>(local_fa0,(char (*) [2])"2",local_fa8);
  local_f48 = &local_f98;
  local_f40 = 2;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               *)&pos.field_0xe5);
  __l._M_len = local_f40;
  __l._M_array = local_f48;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map(&local_f38,__l,0,(hasher *)&pos.field_0xe7,(key_equal *)&pos.field_0xe6,
                  (allocator_type *)&pos.field_0xe5);
  pos._224_4_ = 0;
  args::
  MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_args::ValueReader,_args::detail::unordered_map>
  ::MapFlag((MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_args::ValueReader,_args::detail::unordered_map>
             *)local_dd8,(Group *)local_4d8,&local_df8,&local_e20,(Matcher *)(local_ea0 + 8),
            &local_f38,(int *)&pos.field_0xe0,false);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~unordered_map(&local_f38);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                *)&pos.field_0xe5);
  local_11b8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)&local_f48;
  do {
    local_11b8 = local_11b8 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~pair(local_11b8);
  } while (local_11b8 != &local_f98);
  args::Matcher::~Matcher((Matcher *)(local_ea0 + 8));
  local_11d0 = (EitherFlag *)&local_ea8;
  do {
    local_11d0 = local_11d0 + -1;
    args::EitherFlag::~EitherFlag(local_11d0);
  } while (local_11d0 != &local_ef8);
  std::__cxx11::string::~string((string *)&local_e20);
  std::allocator<char>::~allocator((allocator<char> *)&local_e21);
  std::__cxx11::string::~string((string *)&local_df8);
  std::allocator<char>::~allocator((allocator<char> *)&local_df9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_10b8,"name",&local_10b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_10e0,"desc",&local_10e1);
  std::__cxx11::string::string((string *)&e);
  args::
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::Positional((Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
                *)local_1098,(Group *)local_4d8,&local_10b8,&local_10e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,None);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::~string((string *)&local_10e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10e1);
  std::__cxx11::string::~string((string *)&local_10b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10b9);
  args::ArgumentParser::ParseCLI
            ((ArgumentParser *)local_4d8,argc,(char **)p.helpParams.defaultString.field_2._8_8_);
  args::
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::~Positional((Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
                 *)local_1098);
  args::
  MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_args::ValueReader,_args::detail::unordered_map>
  ::~MapFlag((MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_args::ValueReader,_args::detail::unordered_map>
              *)local_dd8);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
                *)local_b30);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
                *)local_888);
  args::CompletionFlag::~CompletionFlag((CompletionFlag *)local_680);
  args::ArgumentParser::~ArgumentParser((ArgumentParser *)local_4d8);
  return 0;
}

Assistant:

int main(int argc, const char **argv)
{
    args::ArgumentParser p("parser");
    args::CompletionFlag c(p, {"complete"});
    args::ValueFlag<std::string> f(p, "name", "description", {'f', "foo"}, "abc");
    args::ValueFlag<std::string> b(p, "name", "description", {'b', "bar"}, "abc");
    args::MapFlag<std::string, int> m(p, "mappos", "mappos", {'m', "map"}, {{"1",1}, {"2", 2}});
    args::Positional<std::string> pos(p, "name", "desc");

    try
    {
        p.ParseCLI(argc, argv);
    }
    catch (args::Completion &e)
    {
        std::cout << e.what();
    }

    return 0;
}